

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

void __thiscall llvm::DWARFVerifier::verifyDebugLineStmtOffsets(DWARFVerifier *this)

{
  size_t *Fmt;
  ulong uVar1;
  unsigned_long *puVar2;
  LineTable *pLVar3;
  long lVar4;
  iterator iVar5;
  raw_ostream *prVar6;
  mapped_type *pmVar7;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar8;
  unit_iterator_range uVar9;
  Optional<unsigned_long> OVar10;
  undefined1 local_e8 [8];
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  StmtListToDie;
  format_object_base local_80;
  uint64_t local_70;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_68;
  Optional<unsigned_long> StmtSectionOffset;
  DWARFDie Die;
  ulong local_40;
  uint64_t LineTableOffset;
  
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&StmtListToDie;
  StmtListToDie._M_t._M_impl._0_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  LineTableOffset = (uint64_t)this;
  uVar9 = DWARFContext::info_section_units(this->DCtx);
  Fmt = &StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count;
  do {
    puVar8 = uVar9.begin_iterator;
    if (puVar8 == uVar9.end_iterator) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                   *)local_e8);
      return;
    }
    join_0x00000010_0x00000000_ =
         DWARFUnit::getUnitDIE
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                    .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,true);
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)Fmt,
                   (DWARFDie *)&StmtSectionOffset.Storage.hasVal,DW_AT_stmt_list);
    OVar10 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)Fmt);
    local_68 = OVar10.Storage.field_0;
    StmtSectionOffset.Storage.field_0.empty = OVar10.Storage.hasVal;
    if (((undefined1  [16])OVar10.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_68);
      local_40 = *puVar2;
      pLVar3 = DWARFContext::getLineTableForUnit
                         (*(DWARFContext **)(LineTableOffset + 8),
                          (puVar8->_M_t).
                          super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                          .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl);
      uVar1 = local_40;
      lVar4 = (**(code **)(**(long **)(*(long *)(LineTableOffset + 8) + 0x178) + 0x78))();
      if (uVar1 < *(ulong *)(lVar4 + 8)) {
        if (pLVar3 == (LineTable *)0x0) {
          *(int *)(LineTableOffset + 0x58) = *(int *)(LineTableOffset + 0x58) + 1;
          prVar6 = error((DWARFVerifier *)LineTableOffset);
          prVar6 = raw_ostream::operator<<(prVar6,".debug_line[");
          StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)&PTR_home_01127cf0;
          prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)Fmt);
          raw_ostream::operator<<(prVar6,"] was not able to be parsed for CU:\n");
          prVar6 = dump((DWARFVerifier *)LineTableOffset,
                        (DWARFDie *)&StmtSectionOffset.Storage.hasVal,0);
          raw_ostream::operator<<(prVar6,'\n');
        }
        else {
          iVar5 = std::
                  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                  ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDie>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDie>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                          *)local_e8,&local_40);
          if (iVar5._M_node == (_Base_ptr)&StmtListToDie) {
            pmVar7 = std::
                     map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                     ::operator[]((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                                   *)local_e8,&local_40);
            pmVar7->U = (DWARFUnit *)StmtSectionOffset.Storage._8_8_;
            pmVar7->Die = (DWARFDebugInfoEntry *)Die.U;
          }
          else {
            *(int *)(LineTableOffset + 0x58) = *(int *)(LineTableOffset + 0x58) + 1;
            prVar6 = error((DWARFVerifier *)LineTableOffset);
            prVar6 = raw_ostream::operator<<(prVar6,"two compile unit DIEs, ");
            DWARFDie::getOffset((DWARFDie *)&iVar5._M_node[1]._M_parent);
            StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)&PTR_home_01127cf0;
            prVar6 = raw_ostream::operator<<(prVar6,(format_object_base *)Fmt);
            prVar6 = raw_ostream::operator<<(prVar6," and ");
            local_70 = DWARFDie::getOffset((DWARFDie *)&StmtSectionOffset.Storage.hasVal);
            local_80.Fmt = "0x%08lx";
            local_80._vptr_format_object_base = (_func_int **)&PTR_home_01127cf0;
            prVar6 = raw_ostream::operator<<(prVar6,&local_80);
            raw_ostream::operator<<(prVar6,", have the same DW_AT_stmt_list section offset:\n");
            dump((DWARFVerifier *)LineTableOffset,(DWARFDie *)&iVar5._M_node[1]._M_parent,0);
            prVar6 = dump((DWARFVerifier *)LineTableOffset,
                          (DWARFDie *)&StmtSectionOffset.Storage.hasVal,0);
            raw_ostream::operator<<(prVar6,'\n');
          }
        }
      }
      else if (pLVar3 != (LineTable *)0x0) {
        __assert_fail("LineTable == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                      ,0x2a7,"void llvm::DWARFVerifier::verifyDebugLineStmtOffsets()");
      }
    }
    uVar9.end_iterator = uVar9.end_iterator;
    uVar9.begin_iterator = puVar8 + 1;
  } while( true );
}

Assistant:

void DWARFVerifier::verifyDebugLineStmtOffsets() {
  std::map<uint64_t, DWARFDie> StmtListToDie;
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    // Get the attribute value as a section offset. No need to produce an
    // error here if the encoding isn't correct because we validate this in
    // the .debug_info verifier.
    auto StmtSectionOffset = toSectionOffset(Die.find(DW_AT_stmt_list));
    if (!StmtSectionOffset)
      continue;
    const uint64_t LineTableOffset = *StmtSectionOffset;
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    if (LineTableOffset < DCtx.getDWARFObj().getLineSection().Data.size()) {
      if (!LineTable) {
        ++NumDebugLineErrors;
        error() << ".debug_line[" << format("0x%08" PRIx64, LineTableOffset)
                << "] was not able to be parsed for CU:\n";
        dump(Die) << '\n';
        continue;
      }
    } else {
      // Make sure we don't get a valid line table back if the offset is wrong.
      assert(LineTable == nullptr);
      // Skip this line table as it isn't valid. No need to create an error
      // here because we validate this in the .debug_info verifier.
      continue;
    }
    auto Iter = StmtListToDie.find(LineTableOffset);
    if (Iter != StmtListToDie.end()) {
      ++NumDebugLineErrors;
      error() << "two compile unit DIEs, "
              << format("0x%08" PRIx64, Iter->second.getOffset()) << " and "
              << format("0x%08" PRIx64, Die.getOffset())
              << ", have the same DW_AT_stmt_list section offset:\n";
      dump(Iter->second);
      dump(Die) << '\n';
      // Already verified this line table before, no need to do it again.
      continue;
    }
    StmtListToDie[LineTableOffset] = Die;
  }
}